

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandDetector.cpp
# Opt level: O0

void __thiscall HandDetector::checkHands(HandDetector *this)

{
  bool bVar1;
  __normal_iterator<Hand_*,_std::vector<Hand,_std::allocator<Hand>_>_> local_50;
  __normal_iterator<Hand_*,_std::vector<Hand,_std::allocator<Hand>_>_> local_48;
  const_iterator local_40;
  reference local_38;
  Hand *h;
  iterator __end1;
  iterator __begin1;
  vector<Hand,_std::allocator<Hand>_> *__range1;
  int i;
  HandDetector *this_local;
  
  __range1._4_4_ = 0;
  __end1 = std::vector<Hand,_std::allocator<Hand>_>::begin(&this->hands);
  h = (Hand *)std::vector<Hand,_std::allocator<Hand>_>::end(&this->hands);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Hand_*,_std::vector<Hand,_std::allocator<Hand>_>_>
                                     *)&h), bVar1) {
    local_38 = __gnu_cxx::__normal_iterator<Hand_*,_std::vector<Hand,_std::allocator<Hand>_>_>::
               operator*(&__end1);
    bVar1 = Hand::checkSize(local_38);
    if ((!bVar1) ||
       (bVar1 = std::vector<Finger,_std::allocator<Finger>_>::empty(&local_38->fingers), bVar1)) {
      local_50._M_current = (Hand *)std::vector<Hand,_std::allocator<Hand>_>::begin(&this->hands);
      local_48 = __gnu_cxx::__normal_iterator<Hand_*,_std::vector<Hand,_std::allocator<Hand>_>_>::
                 operator+(&local_50,(long)__range1._4_4_);
      __gnu_cxx::__normal_iterator<Hand_const*,std::vector<Hand,std::allocator<Hand>>>::
      __normal_iterator<Hand*>
                ((__normal_iterator<Hand_const*,std::vector<Hand,std::allocator<Hand>>> *)&local_40,
                 &local_48);
      std::vector<Hand,_std::allocator<Hand>_>::erase(&this->hands,local_40);
    }
    __range1._4_4_ = __range1._4_4_ + 1;
    __gnu_cxx::__normal_iterator<Hand_*,_std::vector<Hand,_std::allocator<Hand>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void HandDetector::checkHands() {
    int i = 0;
    for (Hand &h : hands) {
        if (!h.checkSize() || h.fingers.empty())
            hands.erase(hands.begin() + i);
        i++;
    }
}